

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidget::setPalette(QWidget *this,QPalette *palette)

{
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  bool in_stack_00000013;
  WidgetAttribute in_stack_00000014;
  QWidgetPrivate *d;
  QPalette resolvedPalette;
  QPalette naturalPalette;
  QPalette *palette_00;
  QPalettePrivate *in_stack_ffffffffffffffd8;
  QWidgetPrivate *in_stack_ffffffffffffffe0;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QWidget *)0x36c88e);
  QPalette::resolveMask();
  setAttribute((QWidget *)d,in_stack_00000014,in_stack_00000013);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  palette_00 = (QPalette *)local_18;
  QWidgetPrivate::naturalWidgetPalette
            (in_stack_ffffffffffffffe0,(ResolveMask)in_stack_ffffffffffffffd8);
  QPalette::resolve((QPalette *)&stack0xffffffffffffffd8);
  QWidgetPrivate::setPalette_helper(this_00,palette_00);
  QPalette::~QPalette((QPalette *)&stack0xffffffffffffffd8);
  QPalette::~QPalette(palette_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setPalette(const QPalette &palette)
{
    Q_D(QWidget);
    setAttribute(Qt::WA_SetPalette, palette.resolveMask() != 0);

    // Determine which palette is inherited from this widget's ancestors and
    // QApplication::palette, resolve this against \a palette (attributes from
    // the inherited palette are copied over this widget's palette). Then
    // propagate this palette to this widget's children.
    QPalette naturalPalette = d->naturalWidgetPalette(d->inheritedPaletteResolveMask);
    QPalette resolvedPalette = palette.resolve(naturalPalette);
    d->setPalette_helper(resolvedPalette);
}